

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

vector3d * tinyusdz::vcross(vector3d *__return_storage_ptr__,vector3d *a,vector3d *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  vector3d *n;
  vector3d *b_local;
  vector3d *a_local;
  
  dVar2 = value::vector3d::operator[](a,1);
  dVar3 = value::vector3d::operator[](b,2);
  dVar4 = value::vector3d::operator[](a,2);
  dVar5 = value::vector3d::operator[](b,1);
  pdVar1 = value::vector3d::operator[](__return_storage_ptr__,0);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::vector3d::operator[](a,2);
  dVar3 = value::vector3d::operator[](b,0);
  dVar4 = value::vector3d::operator[](a,0);
  dVar5 = value::vector3d::operator[](b,2);
  pdVar1 = value::vector3d::operator[](__return_storage_ptr__,1);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::vector3d::operator[](a,0);
  dVar3 = value::vector3d::operator[](b,1);
  dVar4 = value::vector3d::operator[](a,1);
  dVar5 = value::vector3d::operator[](b,0);
  pdVar1 = value::vector3d::operator[](__return_storage_ptr__,2);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  return __return_storage_ptr__;
}

Assistant:

value::vector3d vcross(const value::vector3d &a, const value::vector3d &b)
{
  value::vector3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}